

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# millerrabin.c
# Opt level: O1

void miller_rabin_free(MillerRabin *mr)

{
  mp_free(mr->pm1);
  mp_free(mr->m_pm1);
  mp_free(mr->lowbit);
  mp_free(mr->two);
  monty_free(mr->mc);
  smemclr(mr,0x28);
  safefree(mr);
  return;
}

Assistant:

void miller_rabin_free(MillerRabin *mr)
{
    mp_free(mr->pm1);
    mp_free(mr->m_pm1);
    mp_free(mr->lowbit);
    mp_free(mr->two);
    monty_free(mr->mc);
    smemclr(mr, sizeof(*mr));
    sfree(mr);
}